

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testDoubleToString(int count)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  string local_40;
  ulong uVar5;
  
  lVar1 = GetTickCount();
  uVar3 = 0;
  uVar5 = (ulong)(uint)count;
  if (count < 1) {
    uVar5 = uVar3;
  }
  while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
    FIX::DoubleConvertor::convert_abi_cxx11_(&local_40,(DoubleConvertor *)0x0,123.45,0xf,(int)uVar3)
    ;
    std::__cxx11::string::~string((string *)&local_40);
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testDoubleToString( int count )
{
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::DoubleConvertor::convert( 123.45 );
  }
  return GetTickCount() - start;
}